

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::HttpMethod> __thiscall kj::consumeHttpMethod(kj *this,char **ptr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  HttpMethod local_88 [26];
  char *local_20;
  char *p;
  char **ptr_local;
  
  pcVar5 = *ptr;
  local_20 = pcVar5 + 1;
  uVar2 = (int)*pcVar5 - 0x41;
  p = (char *)ptr;
  ptr_local = (char **)this;
  if (uVar2 < 0x14 || *pcVar5 == 0x55) {
    switch((long)&switchD_004a24fa::switchdataD_0065dd10 +
           (long)(int)(&switchD_004a24fa::switchdataD_0065dd10)[uVar2]) {
    case 0x4a24fc:
      iVar3 = strncmp(local_20,"CL",2);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 2;
        local_88[0x19] = 0x11;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x19);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2556:
      pcVar5 = pcVar5 + 2;
      if (*local_20 == 'H') {
        local_20 = pcVar5;
        iVar3 = strncmp(pcVar5,"ECKOUT",6);
        if (iVar3 == 0) {
          *(char **)p = local_20 + 6;
          local_88[0x18] = 0x14;
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x18);
        }
        else {
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
        }
      }
      else if (*local_20 == 'O') {
        local_20 = pcVar5;
        iVar3 = strncmp(pcVar5,"PY",2);
        if (iVar3 == 0) {
          *(char **)p = local_20 + 2;
          local_88[0x17] = 9;
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x17);
        }
        else {
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
        }
      }
      else {
        local_20 = pcVar5;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a264d:
      iVar3 = strncmp(local_20,"ELETE",5);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 5;
        local_88[0x16] = 4;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x16);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a26a7:
      iVar3 = strncmp(local_20,"ET",2);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 2;
        local_88[0x15] = 0;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x15);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2701:
      iVar3 = strncmp(local_20,"EAD",3);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 3;
        local_88[0x14] = 1;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x14);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a275b:
      iVar3 = strncmp(local_20,"OCK",3);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 3;
        local_88[0x13] = 10;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x13);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a27b5:
      pcVar4 = pcVar5 + 2;
      uVar2 = (int)*local_20 - 0x45;
      if (uVar2 < 0xe || *local_20 == 0x53) {
        switch((long)&switchD_004a27f0::switchdataD_0065ddb8 +
               (long)(int)(&switchD_004a27f0::switchdataD_0065ddb8)[uVar2]) {
        case 0x4a27f2:
          local_20 = pcVar4;
          iVar3 = strncmp(pcVar4,"RGE",3);
          if (iVar3 == 0) {
            *(char **)p = local_20 + 3;
            local_88[0x12] = 0x15;
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x12);
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
          break;
        case 0x4a284c:
          local_20 = pcVar5 + 3;
          if (*pcVar4 == 'A') {
            iVar3 = strncmp(local_20,"CTIVITY",7);
            if (iVar3 == 0) {
              *(char **)p = local_20 + 7;
              local_88[0x11] = 0x13;
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x11);
            }
            else {
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
            }
          }
          else if (*pcVar4 == 'C') {
            iVar3 = strncmp(local_20,"OL",2);
            if (iVar3 == 0) {
              *(char **)p = local_20 + 2;
              local_88[0x10] = 0xb;
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0x10);
            }
            else {
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
            }
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
          break;
        case 0x4a2943:
          local_20 = pcVar4;
          iVar3 = strncmp(pcVar4,"VE",2);
          if (iVar3 == 0) {
            *(char **)p = local_20 + 2;
            local_88[0xf] = 0xc;
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0xf);
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
          break;
        case 0x4a299d:
          local_20 = pcVar4;
          iVar3 = strncmp(pcVar4,"EARCH",5);
          if (iVar3 == 0) {
            *(char **)p = local_20 + 5;
            local_88[0xe] = 0x16;
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0xe);
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
          break;
        default:
          goto switchD_004a27f0_caseD_4a29f7;
        }
      }
      else {
switchD_004a27f0_caseD_4a29f7:
        local_20 = pcVar4;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2a0c:
      iVar3 = strncmp(local_20,"OTIFY",5);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 5;
        local_88[0xd] = 0x17;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0xd);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2a66:
      iVar3 = strncmp(local_20,"PTIONS",6);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 6;
        local_88[0xc] = 7;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0xc);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2ac0:
      pcVar4 = pcVar5 + 2;
      uVar2 = (int)*local_20 - 0x41;
      if (uVar2 < 0x14 || *local_20 == 0x55) {
        switch((long)&switchD_004a2afb::switchdataD_0065dd64 +
               (long)(int)(&switchD_004a2afb::switchdataD_0065dd64)[uVar2]) {
        case 0x4a2afd:
          local_20 = pcVar4;
          iVar3 = strncmp(pcVar4,"TCH",3);
          if (iVar3 == 0) {
            *(char **)p = local_20 + 3;
            local_88[0xb] = 5;
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 0xb);
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
          break;
        case 0x4a2b57:
          local_20 = pcVar4;
          iVar3 = strncmp(pcVar4,"ST",2);
          if (iVar3 == 0) {
            *(char **)p = local_20 + 2;
            local_88[10] = 2;
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 10);
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
          break;
        case 0x4a2bb1:
          local_20 = pcVar5 + 3;
          if ((*pcVar4 == 'O') && (local_20 = pcVar5 + 4, pcVar5[3] == 'P')) {
            local_20 = pcVar5 + 5;
            cVar1 = pcVar5[4];
            if (cVar1 == 'F') {
              iVar3 = strncmp(local_20,"IND",3);
              if (iVar3 == 0) {
                *(char **)p = local_20 + 3;
                local_88[9] = 0xd;
                Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 9);
              }
              else {
                Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
              }
            }
            else if (cVar1 == 'P') {
              iVar3 = strncmp(local_20,"ATCH",4);
              if (iVar3 == 0) {
                *(char **)p = local_20 + 4;
                local_88[8] = 0xe;
                Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 8);
              }
              else {
                Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
              }
            }
            else {
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
            }
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
          break;
        case 0x4a2ceb:
          local_20 = pcVar5 + 3;
          if (*pcVar4 == 'R') {
            iVar3 = strncmp(local_20,"GE",2);
            if (iVar3 == 0) {
              *(char **)p = local_20 + 2;
              local_88[7] = 6;
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 7);
            }
            else {
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
            }
          }
          else if (*pcVar4 == 'T') {
            iVar3 = strncmp(local_20,"",0);
            if (iVar3 == 0) {
              *(char **)p = local_20;
              local_88[6] = 3;
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 6);
            }
            else {
              Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
            }
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
          break;
        default:
          goto switchD_004a2afb_caseD_4a2ddd;
        }
      }
      else {
switchD_004a2afb_caseD_4a2ddd:
        local_20 = pcVar4;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2df2:
      iVar3 = strncmp(local_20,"EPORT",5);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 5;
        local_88[5] = 0x12;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 5);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2e4c:
      pcVar5 = pcVar5 + 2;
      if (*local_20 == 'E') {
        local_20 = pcVar5;
        iVar3 = strncmp(pcVar5,"ARCH",4);
        if (iVar3 == 0) {
          *(char **)p = local_20 + 4;
          local_88[4] = 0xf;
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 4);
        }
        else {
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
        }
      }
      else if (*local_20 == 'U') {
        local_20 = pcVar5;
        iVar3 = strncmp(pcVar5,"BSCRIBE",7);
        if (iVar3 == 0) {
          *(char **)p = local_20 + 7;
          local_88[3] = 0x18;
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 3);
        }
        else {
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
        }
      }
      else {
        local_20 = pcVar5;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2f43:
      iVar3 = strncmp(local_20,"RACE",4);
      if (iVar3 == 0) {
        *(char **)p = local_20 + 4;
        local_88[2] = 8;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 2);
      }
      else {
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    case 0x4a2f9d:
      if (*local_20 == 'N') {
        local_20 = pcVar5 + 3;
        cVar1 = pcVar5[2];
        if (cVar1 == 'L') {
          iVar3 = strncmp(local_20,"OCK",3);
          if (iVar3 == 0) {
            *(char **)p = local_20 + 3;
            local_88[1] = 0x10;
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88 + 1);
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
        }
        else if (cVar1 == 'S') {
          iVar3 = strncmp(local_20,"UBSCRIBE",8);
          if (iVar3 == 0) {
            *(char **)p = local_20 + 8;
            local_88[0] = UNSUBSCRIBE;
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,local_88);
          }
          else {
            Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
          }
        }
        else {
          Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
        }
      }
      else {
        local_20 = pcVar5 + 2;
        Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
      }
      break;
    default:
      goto switchD_004a24fa_caseD_4a30b4;
    }
  }
  else {
switchD_004a24fa_caseD_4a30b4:
    Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,(void *)0x0);
  }
  return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
}

Assistant:

static kj::Maybe<HttpMethod> consumeHttpMethod(char*& ptr) {
  char* p = ptr;

#define EXPECT_REST(prefix, suffix) \
  if (strncmp(p, #suffix, sizeof(#suffix)-1) == 0) { \
    ptr = p + (sizeof(#suffix)-1); \
    return HttpMethod::prefix##suffix; \
  } else { \
    return nullptr; \
  }

  switch (*p++) {
    case 'A': EXPECT_REST(A,CL)
    case 'C':
      switch (*p++) {
        case 'H': EXPECT_REST(CH,ECKOUT)
        case 'O': EXPECT_REST(CO,PY)
        default: return nullptr;
      }
    case 'D': EXPECT_REST(D,ELETE)
    case 'G': EXPECT_REST(G,ET)
    case 'H': EXPECT_REST(H,EAD)
    case 'L': EXPECT_REST(L,OCK)
    case 'M':
      switch (*p++) {
        case 'E': EXPECT_REST(ME,RGE)
        case 'K':
          switch (*p++) {
            case 'A': EXPECT_REST(MKA,CTIVITY)
            case 'C': EXPECT_REST(MKC,OL)
            default: return nullptr;
          }
        case 'O': EXPECT_REST(MO,VE)
        case 'S': EXPECT_REST(MS,EARCH)
        default: return nullptr;
      }
    case 'N': EXPECT_REST(N,OTIFY)
    case 'O': EXPECT_REST(O,PTIONS)
    case 'P':
      switch (*p++) {
        case 'A': EXPECT_REST(PA,TCH)
        case 'O': EXPECT_REST(PO,ST)
        case 'R':
          if (*p++ != 'O' || *p++ != 'P') return nullptr;
          switch (*p++) {
            case 'F': EXPECT_REST(PROPF,IND)
            case 'P': EXPECT_REST(PROPP,ATCH)
            default: return nullptr;
          }
        case 'U':
          switch (*p++) {
            case 'R': EXPECT_REST(PUR,GE)
            case 'T': EXPECT_REST(PUT,)
            default: return nullptr;
          }
        default: return nullptr;
      }
    case 'R': EXPECT_REST(R,EPORT)
    case 'S':
      switch (*p++) {
        case 'E': EXPECT_REST(SE,ARCH)
        case 'U': EXPECT_REST(SU,BSCRIBE)
        default: return nullptr;
      }
    case 'T': EXPECT_REST(T,RACE)
    case 'U':
      if (*p++ != 'N') return nullptr;
      switch (*p++) {
        case 'L': EXPECT_REST(UNL,OCK)
        case 'S': EXPECT_REST(UNS,UBSCRIBE)
        default: return nullptr;
      }
    default: return nullptr;
  }
#undef EXPECT_REST
}